

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveData.cpp
# Opt level: O0

bool __thiscall CDirectiveData::Validate(CDirectiveData *this)

{
  FileManager *this_00;
  bool bVar1;
  u64 uVar2;
  size_t sVar3;
  ulong local_28;
  size_t i;
  CDirectiveData *pCStack_18;
  int num;
  CDirectiveData *this_local;
  
  pCStack_18 = this;
  uVar2 = FileManager::getVirtualAddress(g_fileManager);
  this->RamPos = uVar2;
  local_28 = 0;
  do {
    this_00 = g_fileManager;
    if (this->TotalAmount <= local_28) {
      return false;
    }
    if ((this->Entries[local_28].String & 1U) == 0) {
      bVar1 = evalExpression(this->ExpData + this->Entries[local_28].num,(int *)((long)&i + 4),true)
      ;
      if (!bVar1) {
        return false;
      }
      FileManager::advanceMemory(g_fileManager,this->UnitSize);
    }
    else {
      sVar3 = CByteList::GetLen(&this->StrData,this->Entries[local_28].num);
      FileManager::advanceMemory(this_00,sVar3 * this->UnitSize);
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

bool CDirectiveData::Validate()
{
	RamPos = g_fileManager->getVirtualAddress();

	int num;
	for (size_t i = 0; i < TotalAmount; i++)
	{
		if (Entries[i].String == false)
		{
			if (evalExpression(ExpData[Entries[i].num],num,true) == false)
				return false;
			g_fileManager->advanceMemory(UnitSize);
		} else {
			g_fileManager->advanceMemory(StrData.GetLen(Entries[i].num)*UnitSize);
		}
	}

	return false;
}